

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createTexture_ptex(SemanticParser *this,SP *in)

{
  undefined1 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar2;
  string *in_stack_00000050;
  ParamSet *in_stack_00000058;
  string fileName;
  ostream *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_59 [33];
  string local_38 [56];
  
  std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b2ffe);
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  syntactic::ParamSet::getParamString(in_stack_00000058,in_stack_00000050);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (char *)in_stack_ffffffffffffff48);
  if ((bool)uVar1) {
    in_stack_ffffffffffffff48 =
         std::operator<<((ostream *)&std::cerr,"warning: pbrt image texture, but no filename!?");
    std::ostream::operator<<(in_stack_ffffffffffffff48,std::endl<char,std::char_traits<char>>);
  }
  std::make_shared<pbrt::PtexFileTexture,std::__cxx11::string_const&>(__args);
  std::shared_ptr<pbrt::Texture>::shared_ptr<pbrt::PtexFileTexture,void>
            ((shared_ptr<pbrt::Texture> *)CONCAT17(uVar1,in_stack_ffffffffffffff50),
             (shared_ptr<pbrt::PtexFileTexture> *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::PtexFileTexture>::~shared_ptr((shared_ptr<pbrt::PtexFileTexture> *)0x1b312a)
  ;
  std::__cxx11::string::~string(local_38);
  SVar2.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar2.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_ptex(pbrt::syntactic::Texture::SP in)
  {
    const std::string fileName = in->getParamString("filename");
    if (fileName == "")
      std::cerr << "warning: pbrt image texture, but no filename!?" << std::endl;
    return std::make_shared<PtexFileTexture>(fileName);
  }